

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

void __thiscall DSDcc::Viterbi::initCodes(Viterbi *this)

{
  uchar uVar1;
  long in_RAX;
  int i;
  long lVar2;
  long lVar3;
  uchar dataBit;
  long lStack_38;
  uchar symbol;
  
  lVar3 = 0;
  lStack_38 = in_RAX;
  for (lVar2 = 0; lVar2 < 1 << ((char)this->m_k - 1U & 0x1f); lVar2 = lVar2 + 1) {
    uVar1 = symbol;
    encodeToSymbols(this,&symbol,&dataBit,1,(uint)lVar3);
    this->m_branchCodes[lVar3] = symbol;
    lStack_38 = (ulong)symbol << 0x38;
    encodeToSymbols(this,&symbol,&dataBit,1,(uint)lVar3);
    this->m_branchCodes[lVar3 + 1] = uVar1;
    lVar3 = lVar3 + 2;
  }
  return;
}

Assistant:

void Viterbi::initCodes()
{
	unsigned char symbol;
	unsigned char dataBit;

	for (int i = 0; i < (1<<(m_k-1)); i++)
	{
		dataBit = 0;
		encodeToSymbols(&symbol, &dataBit, 1, i<<1);
		m_branchCodes[2*i] = symbol;
        dataBit = 1;
        encodeToSymbols(&symbol, &dataBit, 1, i<<1);
        m_branchCodes[2*i+1] = symbol;
	}
}